

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O1

int __thiscall
raspicam::_private::Private_Impl_Still::startCapture
          (Private_Impl_Still *this,imageTakenCallback userCallback,uchar *preallocated_data,
          uint offset,uint length)

{
  int iVar1;
  MMAL_PORT_USERDATA_T *pMVar2;
  
  pMVar2 = (MMAL_PORT_USERDATA_T *)operator_new(0x38);
  *(undefined8 *)pMVar2 = 0;
  *(undefined8 *)(pMVar2 + 8) = 0;
  *(undefined8 *)(pMVar2 + 0x10) = 0;
  *(undefined8 *)(pMVar2 + 0x18) = 0;
  *(undefined8 *)(pMVar2 + 0x20) = 0;
  *(undefined8 *)(pMVar2 + 0x28) = 0;
  *(undefined8 *)(pMVar2 + 0x30) = 0;
  *(Private_Impl_Still **)pMVar2 = this;
  *(MMAL_POOL_T **)(pMVar2 + 8) = this->encoder_pool;
  *(undefined8 *)(pMVar2 + 0x18) = 0;
  *(uchar **)(pMVar2 + 0x20) = preallocated_data;
  *(undefined4 *)(pMVar2 + 0x28) = 0;
  *(uint *)(pMVar2 + 0x30) = offset;
  *(uint *)(pMVar2 + 0x2c) = offset;
  *(uint *)(pMVar2 + 0x34) = length;
  *(imageTakenCallback *)(pMVar2 + 0x10) = userCallback;
  this->encoder_output_port->userdata = pMVar2;
  iVar1 = startCapture(this);
  return iVar1;
}

Assistant:

int Private_Impl_Still::startCapture ( imageTakenCallback userCallback, unsigned char * preallocated_data, unsigned int offset, unsigned int length ) {
            RASPICAM_USERDATA * userdata = new RASPICAM_USERDATA();
            userdata->cameraBoard = this;
            userdata->encoderPool = encoder_pool;
            userdata->mutex = NULL;
            userdata->data = preallocated_data;
            userdata->bufferPosition = 0;
            userdata->offset = offset;
            userdata->startingOffset = offset;
            userdata->length = length;
            userdata->imageCallback = userCallback;
            encoder_output_port->userdata = ( struct MMAL_PORT_USERDATA_T * ) userdata;
            return startCapture();
        }